

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O0

void __thiscall
TradeApi::on_account_status(TradeApi *this,shared_ptr<tquant::api::AccountInfo> *account)

{
  element_type *account_00;
  undefined1 local_48 [8];
  AccountInfo c_account;
  shared_ptr<tquant::api::AccountInfo> *account_local;
  TradeApi *this_local;
  
  if (this->cb != (TradeApiCallback *)0x0) {
    c_account.account_type = (char *)account;
    account_00 = std::__shared_ptr<tquant::api::AccountInfo,_(__gnu_cxx::_Lock_policy)2>::get
                           (&account->
                             super___shared_ptr<tquant::api::AccountInfo,_(__gnu_cxx::_Lock_policy)2>
                           );
    init_caccount((AccountInfo *)local_48,account_00);
    (*this->cb->on_account_status)((AccountInfo *)local_48,this->cb->user_data);
  }
  return;
}

Assistant:

virtual void on_account_status(shared_ptr<tquant::api::AccountInfo> account) override {
        if (cb) {
            AccountInfo c_account;
            init_caccount(&c_account, account.get());
            cb->on_account_status(&c_account, cb->user_data);
        }
    }